

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTestInstance::ShaderPackingFunctionTestInstance
          (ShaderPackingFunctionTestInstance *this,Context *context,ShaderType shaderType,
          ShaderSpec *spec,char *name)

{
  ShaderType shaderType_00;
  Context *context_00;
  TestContext *pTVar1;
  ShaderExecutor *pSVar2;
  DefaultDeleter<vkt::shaderexecutor::ShaderExecutor> local_49;
  VkDescriptorSetLayout local_48 [3];
  char *local_30;
  char *name_local;
  ShaderSpec *spec_local;
  Context *pCStack_18;
  ShaderType shaderType_local;
  Context *context_local;
  ShaderPackingFunctionTestInstance *this_local;
  
  local_30 = name;
  name_local = (char *)spec;
  spec_local._4_4_ = shaderType;
  pCStack_18 = context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderPackingFunctionTestInstance_016b6f70;
  pTVar1 = Context::getTestContext(pCStack_18);
  this->m_testCtx = pTVar1;
  this->m_shaderType = spec_local._4_4_;
  ShaderSpec::ShaderSpec(&this->m_spec,(ShaderSpec *)name_local);
  context_00 = pCStack_18;
  this->m_name = local_30;
  shaderType_00 = this->m_shaderType;
  ::vk::Handle<(vk::HandleType)19>::Handle(local_48,0);
  pSVar2 = createExecutor(context_00,shaderType_00,&this->m_spec,local_48[0]);
  de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>::DefaultDeleter(&local_49);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::UniquePtr(&this->m_executor,pSVar2);
  return;
}

Assistant:

ShaderPackingFunctionTestInstance	(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
											: TestInstance	(context)
											, m_testCtx		(context.getTestContext())
											, m_shaderType	(shaderType)
											, m_spec		(spec)
											, m_name		(name)
											, m_executor	(createExecutor(context, m_shaderType, m_spec))
										{
										}